

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

bool __thiscall crnlib::ktx_texture::consistency_check(ktx_texture *this)

{
  uint32 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint8_vec *this_00;
  uint expected_image_size;
  uint8_vec *image_data;
  uint local_40;
  uint zslice;
  uint face;
  uint array_element;
  uint mip_col_blocks;
  uint mip_row_blocks;
  uint mip_depth;
  uint mip_height;
  uint mip_width;
  uint mip_level;
  uint bytes_per_block;
  uint block_dim;
  ktx_texture *this_local;
  
  _bytes_per_block = this;
  bVar2 = check_header(this);
  if (!bVar2) {
    return false;
  }
  mip_level = 0;
  mip_width = 0;
  if (((this->m_header).m_glType == 0) || ((this->m_header).m_glFormat == 0)) {
    if (((this->m_header).m_glType != 0) || ((this->m_header).m_glFormat != 0)) {
      return false;
    }
    bVar2 = get_ogl_fmt_desc((this->m_header).m_glInternalFormat,(this->m_header).m_glType,
                             &mip_level,&mip_width);
    if (!bVar2) {
      return false;
    }
    if (mip_level == 1) {
      return false;
    }
  }
  else {
    bVar2 = get_ogl_fmt_desc((this->m_header).m_glFormat,(this->m_header).m_glType,&mip_level,
                             &mip_width);
    if (!bVar2) {
      return false;
    }
    if (1 < mip_level) {
      return false;
    }
  }
  if ((this->m_block_dim == mip_level) && (this->m_bytes_per_block == mip_width)) {
    uVar3 = vector<crnlib::vector<unsigned_char>_>::size(&this->m_image_data);
    uVar4 = get_total_images(this);
    if (uVar3 == uVar4) {
      for (mip_height = 0; uVar3 = mip_height, uVar4 = get_num_mips(this), uVar3 < uVar4;
          mip_height = mip_height + 1) {
        get_mip_dim(this,mip_height,&mip_depth,&mip_row_blocks,&mip_col_blocks);
        uVar5 = ((mip_depth + this->m_block_dim) - 1) / this->m_block_dim;
        uVar6 = ((mip_row_blocks + this->m_block_dim) - 1) / this->m_block_dim;
        if ((uVar5 == 0) || (uVar6 == 0)) {
          return false;
        }
        for (zslice = 0; uVar3 = get_array_size(this), zslice < uVar3; zslice = zslice + 1) {
          for (local_40 = 0; uVar3 = get_num_faces(this), local_40 < uVar3; local_40 = local_40 + 1)
          {
            for (image_data._4_4_ = 0; image_data._4_4_ < mip_col_blocks;
                image_data._4_4_ = image_data._4_4_ + 1) {
              uVar3 = get_image_index(this,mip_height,zslice,local_40,image_data._4_4_);
              this_00 = get_image_data(this,uVar3);
              uVar1 = this->m_bytes_per_block;
              uVar3 = vector<unsigned_char>::size(this_00);
              if (uVar3 != uVar5 * uVar6 * uVar1) {
                return false;
              }
            }
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ktx_texture::consistency_check() const
    {
        if (!check_header())
        {
            return false;
        }

        uint block_dim = 0, bytes_per_block = 0;
        if ((!m_header.m_glType) || (!m_header.m_glFormat))
        {
            if ((m_header.m_glType) || (m_header.m_glFormat))
            {
                return false;
            }
            if (!get_ogl_fmt_desc(m_header.m_glInternalFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim == 1)
            {
                return false;
            }
            //if ((get_width() % block_dim) || (get_height() % block_dim))
            //   return false;
        }
        else
        {
            if (!get_ogl_fmt_desc(m_header.m_glFormat, m_header.m_glType, block_dim, bytes_per_block))
            {
                return false;
            }
            if (block_dim > 1)
            {
                return false;
            }
        }
        if ((m_block_dim != block_dim) || (m_bytes_per_block != bytes_per_block))
        {
            return false;
        }

        if (m_image_data.size() != get_total_images())
        {
            return false;
        }

        for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++)
        {
            uint mip_width, mip_height, mip_depth;
            get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

            const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
            const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
            if ((!mip_row_blocks) || (!mip_col_blocks))
            {
                return false;
            }

            for (uint array_element = 0; array_element < get_array_size(); array_element++)
            {
                for (uint face = 0; face < get_num_faces(); face++)
                {
                    for (uint zslice = 0; zslice < mip_depth; zslice++)
                    {
                        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));

                        uint expected_image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
                        if (image_data.size() != expected_image_size)
                        {
                            return false;
                        }
                    }
                }
            }
        }

        return true;
    }